

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

size_t readstr<std::shared_ptr<ReadWriter>>(shared_ptr<ReadWriter> *rd,string *v,size_t n)

{
  element_type *peVar1;
  undefined8 uVar2;
  char *str;
  size_t sVar3;
  size_t nr;
  size_t n_local;
  string *v_local;
  shared_ptr<ReadWriter> *rd_local;
  
  std::__cxx11::string::resize((ulong)v);
  peVar1 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      rd);
  uVar2 = std::__cxx11::string::operator[]((ulong)v);
  (*peVar1->_vptr_ReadWriter[2])(peVar1,uVar2,n);
  std::__cxx11::string::resize((ulong)v);
  str = (char *)std::__cxx11::string::operator[]((ulong)v);
  stringlength<char>(str);
  std::__cxx11::string::resize((ulong)v);
  sVar3 = std::__cxx11::string::size();
  return sVar3;
}

Assistant:

size_t readstr(PTR rd, std::string& v, size_t n)
{
    v.resize(n);
    size_t nr= rd->read((uint8_t*)&v[0], n);
    v.resize(nr);
    v.resize(stringlength(&v[0]));
    return v.size();
}